

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedForward.h
# Opt level: O3

void kwsys_shared_forward_print_failure(char **argv)

{
  char *pcVar1;
  char **ppcVar2;
  char msg [4096];
  
  kwsys_shared_forward_strerror(msg);
  fwrite("Error running",0xd,1,_stderr);
  if (*argv != (char *)0x0) {
    ppcVar2 = argv + 1;
    do {
      fprintf(_stderr," \"%s\"");
      pcVar1 = *ppcVar2;
      ppcVar2 = ppcVar2 + 1;
    } while (pcVar1 != (char *)0x0);
  }
  fprintf(_stderr,": %s\n",msg);
  return;
}

Assistant:

static void kwsys_shared_forward_print_failure(char const* const* argv)
{
  char msg[KWSYS_SHARED_FORWARD_MAXPATH];
  char const* const* arg = argv;
  kwsys_shared_forward_strerror(msg);
  fprintf(stderr, "Error running");
  for(; *arg; ++arg)
    {
    fprintf(stderr, " \"%s\"", *arg);
    }
  fprintf(stderr, ": %s\n", msg);
}